

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O0

boolean encode_mcu_DC_first(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  int iVar2;
  huff_entropy_ptr_conflict entropy_00;
  jpeg_component_info *pjVar3;
  int iVar4;
  jpeg_component_info *compptr;
  JBLOCKROW block;
  int Al;
  int ci;
  int blkn;
  int nbits;
  int temp2;
  int temp;
  huff_entropy_ptr_conflict entropy;
  JBLOCKROW *MCU_data_local;
  j_compress_ptr cinfo_local;
  
  entropy_00 = (huff_entropy_ptr_conflict)cinfo->entropy;
  iVar1 = cinfo->Al;
  entropy_00->next_output_byte = cinfo->dest->next_output_byte;
  entropy_00->free_in_buffer = cinfo->dest->free_in_buffer;
  if ((cinfo->restart_interval != 0) && (entropy_00->restarts_to_go == 0)) {
    emit_restart_e(entropy_00,entropy_00->next_restart_num);
  }
  for (Al = 0; Al < cinfo->blocks_in_MCU; Al = Al + 1) {
    iVar2 = cinfo->MCU_membership[Al];
    pjVar3 = cinfo->cur_comp_info[iVar2];
    iVar4 = (int)(*MCU_data[Al])[0] >> ((byte)iVar1 & 0x1f);
    blkn = iVar4 - (entropy_00->saved).last_dc_val[iVar2];
    (entropy_00->saved).last_dc_val[iVar2] = iVar4;
    nbits = blkn;
    if (blkn < 0) {
      nbits = -blkn;
      blkn = blkn + -1;
    }
    ci = 0;
    for (; nbits != 0; nbits = nbits >> 1) {
      ci = ci + 1;
    }
    if (0xb < ci) {
      cinfo->err->msg_code = 6;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    emit_dc_symbol(entropy_00,pjVar3->dc_tbl_no,ci);
    if (ci != 0) {
      emit_bits_e(entropy_00,blkn,ci);
    }
  }
  cinfo->dest->next_output_byte = entropy_00->next_output_byte;
  cinfo->dest->free_in_buffer = entropy_00->free_in_buffer;
  if (cinfo->restart_interval != 0) {
    if (entropy_00->restarts_to_go == 0) {
      entropy_00->restarts_to_go = cinfo->restart_interval;
      entropy_00->next_restart_num = entropy_00->next_restart_num + 1;
      entropy_00->next_restart_num = entropy_00->next_restart_num & 7;
    }
    entropy_00->restarts_to_go = entropy_00->restarts_to_go - 1;
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
encode_mcu_DC_first (j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  register int temp, temp2;
  register int nbits;
  int blkn, ci;
  int Al = cinfo->Al;
  JBLOCKROW block;
  jpeg_component_info * compptr;
  ISHIFT_TEMPS

  entropy->next_output_byte = cinfo->dest->next_output_byte;
  entropy->free_in_buffer = cinfo->dest->free_in_buffer;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval)
    if (entropy->restarts_to_go == 0)
      emit_restart_e(entropy, entropy->next_restart_num);

  /* Encode the MCU data blocks */
  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    block = MCU_data[blkn];
    ci = cinfo->MCU_membership[blkn];
    compptr = cinfo->cur_comp_info[ci];

    /* Compute the DC value after the required point transform by Al.
     * This is simply an arithmetic right shift.
     */
    temp2 = IRIGHT_SHIFT((int) ((*block)[0]), Al);

    /* DC differences are figured on the point-transformed values. */
    temp = temp2 - entropy->saved.last_dc_val[ci];
    entropy->saved.last_dc_val[ci] = temp2;

    /* Encode the DC coefficient difference per section G.1.2.1 */
    temp2 = temp;
    if (temp < 0) {
      temp = -temp;		/* temp is abs value of input */
      /* For a negative input, want temp2 = bitwise complement of abs(input) */
      /* This code assumes we are on a two's complement machine */
      temp2--;
    }
    
    /* Find the number of bits needed for the magnitude of the coefficient */
    nbits = 0;
    while (temp) {
      nbits++;
      temp >>= 1;
    }
    /* Check for out-of-range coefficient values.
     * Since we're encoding a difference, the range limit is twice as much.
     */
    if (nbits > MAX_COEF_BITS+1)
      ERREXIT(cinfo, JERR_BAD_DCT_COEF);
    
    /* Count/emit the Huffman-coded symbol for the number of bits */
    emit_dc_symbol(entropy, compptr->dc_tbl_no, nbits);
    
    /* Emit that number of bits of the value, if positive, */
    /* or the complement of its magnitude, if negative. */
    if (nbits)			/* emit_bits rejects calls with size 0 */
      emit_bits_e(entropy, (unsigned int) temp2, nbits);
  }

  cinfo->dest->next_output_byte = entropy->next_output_byte;
  cinfo->dest->free_in_buffer = entropy->free_in_buffer;

  /* Update restart-interval state too */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  return TRUE;
}